

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFOpcPackage.cpp
# Opt level: O0

void __thiscall
Assimp::D3MF::OpcPackageRelationshipReader::ParseChildNode
          (OpcPackageRelationshipReader *this,XmlReader *xmlReader)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  int iVar3;
  OpcPackageRelationship *this_00;
  undefined8 uVar4;
  undefined4 extraout_var;
  element_type *peVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined1 local_28 [8];
  OpcPackageRelationshipPtr relPtr;
  XmlReader *xmlReader_local;
  OpcPackageRelationshipReader *this_local;
  
  relPtr.super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)xmlReader;
  this_00 = (OpcPackageRelationship *)operator_new(0x60);
  (this_00->target).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this_00->target).field_2 + 8) = 0;
  *(undefined8 *)&this_00->target = 0;
  (this_00->target)._M_string_length = 0;
  (this_00->type).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this_00->type).field_2 + 8) = 0;
  *(undefined8 *)&this_00->type = 0;
  (this_00->type)._M_string_length = 0;
  (this_00->id).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this_00->id).field_2 + 8) = 0;
  *(undefined8 *)&this_00->id = 0;
  (this_00->id)._M_string_length = 0;
  OpcPackageRelationship::OpcPackageRelationship(this_00);
  std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>::
  shared_ptr<Assimp::D3MF::OpcPackageRelationship,void>
            ((shared_ptr<Assimp::D3MF::OpcPackageRelationship> *)local_28,this_00);
  _Var1 = relPtr.
          super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  uVar4 = std::__cxx11::string::c_str();
  iVar3 = (*(_Var1._M_pi)->_vptr__Sp_counted_base[8])(_Var1._M_pi,uVar4);
  peVar5 = std::
           __shared_ptr_access<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
  std::__cxx11::string::operator=((string *)peVar5,(char *)CONCAT44(extraout_var,iVar3));
  _Var1 = relPtr.
          super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  uVar4 = std::__cxx11::string::c_str();
  iVar3 = (*(_Var1._M_pi)->_vptr__Sp_counted_base[8])(_Var1._M_pi,uVar4);
  peVar5 = std::
           __shared_ptr_access<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
  std::__cxx11::string::operator=((string *)&peVar5->type,(char *)CONCAT44(extraout_var_00,iVar3));
  _Var1 = relPtr.
          super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  uVar4 = std::__cxx11::string::c_str();
  iVar3 = (*(_Var1._M_pi)->_vptr__Sp_counted_base[8])(_Var1._M_pi,uVar4);
  peVar5 = std::
           __shared_ptr_access<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
  std::__cxx11::string::operator=((string *)&peVar5->target,(char *)CONCAT44(extraout_var_01,iVar3))
  ;
  bVar2 = validateRels(this,(OpcPackageRelationshipPtr *)local_28);
  if (bVar2) {
    std::
    vector<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
    ::push_back(&this->m_relationShips,(value_type *)local_28);
  }
  std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>::~shared_ptr
            ((shared_ptr<Assimp::D3MF::OpcPackageRelationship> *)local_28);
  return;
}

Assistant:

void ParseChildNode(XmlReader* xmlReader) {        
        OpcPackageRelationshipPtr relPtr(new OpcPackageRelationship());

        relPtr->id = xmlReader->getAttributeValueSafe(XmlTag::RELS_ATTRIB_ID.c_str());
        relPtr->type = xmlReader->getAttributeValueSafe(XmlTag::RELS_ATTRIB_TYPE.c_str());
        relPtr->target = xmlReader->getAttributeValueSafe(XmlTag::RELS_ATTRIB_TARGET.c_str());
        if ( validateRels( relPtr ) ) {
            m_relationShips.push_back( relPtr );
        }
    }